

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O2

bool __thiscall
crnlib::image_utils::error_metrics::compute
          (error_metrics *this,image_u8 *a,image_u8 *b,uint first_channel,uint num_channels,
          bool average_component_error)

{
  color_quad<unsigned_char,_int> *pcVar1;
  color_quad<unsigned_char,_int> *pcVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  uint i;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  byte bVar13;
  uint uVar14;
  uint uVar15;
  uint x;
  uint uVar16;
  bool bVar17;
  double dVar18;
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 auVar21 [16];
  double hist [256];
  
  uVar3 = b->m_width;
  if (a->m_width < b->m_width) {
    uVar3 = a->m_width;
  }
  uVar4 = b->m_height;
  if (a->m_height < b->m_height) {
    uVar4 = a->m_height;
  }
  memset(hist,0,0x800);
  for (uVar15 = 0; uVar15 != uVar4; uVar15 = uVar15 + 1) {
    for (uVar16 = 0; uVar16 != uVar3; uVar16 = uVar16 + 1) {
      uVar9 = a->m_pitch;
      pcVar1 = a->m_pPixels;
      uVar11 = b->m_pitch;
      pcVar2 = b->m_pPixels;
      uVar12 = (ulong)num_channels;
      uVar8 = first_channel;
      if (num_channels == 0) {
        iVar6 = color_quad<unsigned_char,_int>::get_luma(pcVar1 + (uVar9 * uVar15 + uVar16));
        iVar7 = color_quad<unsigned_char,_int>::get_luma(pcVar2 + (uVar11 * uVar15 + uVar16));
        uVar14 = iVar6 - iVar7;
        uVar8 = -uVar14;
        if (0 < (int)uVar14) {
          uVar8 = uVar14;
        }
        hist[uVar8] = hist[uVar8] + 1.0;
      }
      else {
        while( true ) {
          bVar17 = uVar12 == 0;
          uVar12 = uVar12 - 1;
          if (bVar17) break;
          iVar6 = (uint)pcVar1[uVar9 * uVar15 + uVar16].field_0.c[uVar8] -
                  (uint)pcVar2[uVar11 * uVar15 + uVar16].field_0.c[uVar8];
          bVar5 = (byte)iVar6;
          bVar13 = -bVar5;
          if (0 < iVar6) {
            bVar13 = bVar5;
          }
          hist[bVar13] = hist[bVar13] + 1.0;
          uVar8 = uVar8 + 1;
        }
      }
    }
  }
  this->mMax = 0;
  auVar19 = ZEXT816(0);
  uVar15 = 0;
  for (lVar10 = 0; lVar10 != 0x100; lVar10 = lVar10 + 1) {
    dVar20 = hist[lVar10];
    if ((dVar20 != 0.0) || (NAN(dVar20))) {
      uVar16 = (uint)lVar10;
      if (uVar15 <= uVar16) {
        uVar15 = uVar16;
      }
      this->mMax = uVar15;
      dVar20 = dVar20 * (double)(int)uVar16;
      dVar18 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + dVar20;
      auVar19._8_8_ = dVar18 + (double)(int)uVar16 * dVar20;
    }
  }
  dVar20 = (double)(uVar4 * uVar3);
  if (average_component_error) {
    uVar9 = 4;
    if (num_channels < 4) {
      uVar9 = num_channels;
    }
    uVar11 = 1;
    if (num_channels != 0) {
      uVar11 = uVar9;
    }
    dVar20 = dVar20 * (double)(int)uVar11;
  }
  auVar21._8_8_ = dVar20;
  auVar21._0_8_ = dVar20;
  auVar19 = divpd(auVar19,auVar21);
  auVar21 = minpd(_DAT_0018ed50,auVar19);
  dVar20 = (double)(-(ulong)(0.0 <= auVar19._8_8_) & auVar21._8_8_);
  this->mMean = (double)(-(ulong)(0.0 <= auVar19._0_8_) & auVar21._0_8_);
  this->mMeanSquared = dVar20;
  if (dVar20 < 0.0) {
    dVar20 = sqrt(dVar20);
  }
  else {
    dVar20 = SQRT(dVar20);
  }
  this->mRootMeanSquared = dVar20;
  if ((dVar20 != 0.0) || (NAN(dVar20))) {
    dVar18 = log10(255.0 / dVar20);
    dVar18 = dVar18 * 20.0;
    dVar20 = 500.0;
    if (dVar18 <= 500.0) {
      dVar20 = dVar18;
    }
    dVar20 = (double)(~-(ulong)(dVar18 < 0.0) & (ulong)dVar20);
  }
  else {
    dVar20 = 999999.0;
  }
  this->mPeakSNR = dVar20;
  return true;
}

Assistant:

bool error_metrics::compute(const image_u8& a, const image_u8& b, uint first_channel, uint num_channels, bool average_component_error) {
  //if ( (!a.get_width()) || (!b.get_height()) || (a.get_width() != b.get_width()) || (a.get_height() != b.get_height()) )
  //   return false;

  const uint width = math::minimum(a.get_width(), b.get_width());
  const uint height = math::minimum(a.get_height(), b.get_height());

  CRNLIB_ASSERT((first_channel < 4U) && (first_channel + num_channels <= 4U));

  // Histogram approach due to Charles Bloom.
  double hist[256];
  utils::zero_object(hist);

  for (uint y = 0; y < height; y++) {
    for (uint x = 0; x < width; x++) {
      const color_quad_u8& ca = a(x, y);
      const color_quad_u8& cb = b(x, y);

      if (!num_channels)
        hist[labs(ca.get_luma() - cb.get_luma())]++;
      else {
        for (uint c = 0; c < num_channels; c++)
          hist[labs(ca[first_channel + c] - cb[first_channel + c])]++;
      }
    }
  }

  mMax = 0;
  double sum = 0.0f, sum2 = 0.0f;
  for (uint i = 0; i < 256; i++) {
    if (!hist[i])
      continue;

    mMax = math::maximum(mMax, i);

    double x = i * hist[i];

    sum += x;
    sum2 += i * x;
  }

  // See http://bmrc.berkeley.edu/courseware/cs294/fall97/assignment/psnr.html
  double total_values = width * height;

  if (average_component_error)
    total_values *= math::clamp<uint>(num_channels, 1, 4);

  mMean = math::clamp<double>(sum / total_values, 0.0f, 255.0f);
  mMeanSquared = math::clamp<double>(sum2 / total_values, 0.0f, 255.0f * 255.0f);

  mRootMeanSquared = sqrt(mMeanSquared);

  if (!mRootMeanSquared)
    mPeakSNR = cInfinitePSNR;
  else
    mPeakSNR = math::clamp<double>(log10(255.0f / mRootMeanSquared) * 20.0f, 0.0f, 500.0f);

  return true;
}